

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metainfo.c
# Opt level: O1

int ndn_metainfo_tlv_encode(ndn_encoder_t *encoder,ndn_metainfo_t *meta)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint32_t length;
  uint32_t length_00;
  
  uVar4 = (uint)(meta->enable_ContentType != '\0') * 3;
  if (meta->enable_FreshnessPeriod != '\0') {
    uVar1 = meta->freshness_period;
    iVar5 = 3;
    if ((0xff < uVar1) && (iVar5 = 4, 0xffff < uVar1)) {
      iVar5 = (uint)(uVar1 >> 0x20 != 0) * 4 + 6;
    }
    uVar4 = uVar4 + iVar5;
  }
  if (meta->enable_FinalBlockId == '\0') {
    length_00 = 0;
  }
  else {
    uVar3 = (meta->final_block_id).type;
    uVar6 = (uint)(meta->final_block_id).size;
    iVar5 = 1;
    if (0xfc < uVar3) {
      iVar5 = (0xffff < uVar3) + 3 + (uint)(0xffff < uVar3);
    }
    length_00 = iVar5 + uVar6 + (uint)(0xfc < uVar6) * 2 + 1;
    uVar4 = uVar4 + iVar5 + uVar6 + (uint)(0xfc < uVar6) * 2 + (uint)(0xfc < length_00) * 2 + 3;
  }
  if (uVar4 == 0) {
    return 0;
  }
  uVar3 = encoder->offset;
  if (encoder->output_max_size < uVar3 + uVar4 + (uint)(0xfc < uVar4) * 2 + 2) {
    return -10;
  }
  if (encoder->output_max_size == uVar3) {
    return -0xe;
  }
  encoder->output_value[uVar3] = '\x14';
  encoder->offset = encoder->offset + 1;
  uVar3 = encoder->offset;
  if (uVar4 < 0xfd && encoder->output_max_size != uVar3) {
    iVar5 = 1;
  }
  else {
    if (encoder->output_max_size - uVar3 < 3) {
      iVar5 = -0xe;
      bVar2 = false;
      goto LAB_0010da47;
    }
    encoder->output_value[uVar3] = 0xfd;
    encoder->output_value[encoder->offset + 1] = (uint8_t)(uVar4 >> 8);
    uVar3 = encoder->offset + 2;
    iVar5 = 3;
  }
  encoder->output_value[uVar3] = (uint8_t)uVar4;
  encoder->offset = encoder->offset + iVar5;
  iVar5 = 0;
  bVar2 = true;
LAB_0010da47:
  if (!bVar2) {
    return iVar5;
  }
  if (meta->enable_ContentType != '\0') {
    if (encoder->output_max_size == encoder->offset) {
      return -0xe;
    }
    encoder->output_value[encoder->offset] = '\x18';
    encoder->offset = encoder->offset + 1;
    iVar5 = encoder_append_length(encoder,1);
    if (iVar5 != 0) {
      return iVar5;
    }
    if (encoder->output_max_size < encoder->offset + 1) {
      return -10;
    }
    encoder->output_value[encoder->offset] = meta->content_type;
    encoder->offset = encoder->offset + 1;
  }
  if (meta->enable_FreshnessPeriod != '\0') {
    iVar5 = encoder_append_type(encoder,0x19);
    if (iVar5 != 0) {
      return iVar5;
    }
    uVar1 = meta->freshness_period;
    length = 1;
    if ((0xff < uVar1) && (length = 2, 0xffff < uVar1)) {
      length = (uint)(uVar1 >> 0x20 != 0) * 4 + 4;
    }
    iVar5 = encoder_append_length(encoder,length);
    if (iVar5 != 0) {
      return iVar5;
    }
    iVar5 = encoder_append_uint_value(encoder,meta->freshness_period);
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  if ((meta->enable_FinalBlockId == '\0') ||
     (((iVar5 = encoder_append_type(encoder,0x1a), iVar5 == 0 &&
       (iVar5 = encoder_append_length(encoder,length_00), iVar5 == 0)) &&
      (iVar5 = name_component_tlv_encode(encoder,&meta->final_block_id), iVar5 == 0)))) {
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int
ndn_metainfo_tlv_encode(ndn_encoder_t* encoder, const ndn_metainfo_t* meta)
{

  int ret_val = -1;
  
  uint32_t meta_value_size = 0;
  uint32_t comp_tlv_size = 0;
  if (meta->enable_ContentType) {
    meta_value_size += encoder_probe_block_size(TLV_ContentType, 1);
  }
  if (meta->enable_FreshnessPeriod) {
    meta_value_size += encoder_probe_block_size(TLV_FreshnessPeriod, 
                                                encoder_probe_uint_length(meta->freshness_period));
  }
  if (meta->enable_FinalBlockId) {
    comp_tlv_size = name_component_probe_block_size(&meta->final_block_id);
    meta_value_size += encoder_probe_block_size(TLV_FinalBlockId, comp_tlv_size);
  }

  if (meta_value_size == 0)
    return 0;

  if (encoder->offset + encoder_probe_block_size(TLV_MetaInfo, meta_value_size)
      > encoder->output_max_size)
    return NDN_OVERSIZE;

  ret_val = encoder_append_type(encoder, TLV_MetaInfo);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_length(encoder, meta_value_size);
  if (ret_val != NDN_SUCCESS) return ret_val;

  if (meta->enable_ContentType) {
    ret_val = encoder_append_type(encoder, TLV_ContentType);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 1);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_byte_value(encoder, meta->content_type);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  if (meta->enable_FreshnessPeriod) {
    ret_val = encoder_append_type(encoder, TLV_FreshnessPeriod);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, encoder_probe_uint_length(meta->freshness_period));
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint_value(encoder, meta->freshness_period);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  if (meta->enable_FinalBlockId) {
    ret_val = encoder_append_type(encoder, TLV_FinalBlockId);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, comp_tlv_size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = name_component_tlv_encode(encoder, &meta->final_block_id);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  return 0;
}